

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsioContextManager.cpp
# Opt level: O1

shared_ptr<gmlc::networking::AsioContextManager> __thiscall
gmlc::networking::AsioContextManager::getExistingContextPointer
          (AsioContextManager *this,string *contextName)

{
  element_type *peVar1;
  int iVar2;
  iterator iVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<gmlc::networking::AsioContextManager> sVar4;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)contextLock);
  if (iVar2 == 0) {
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>_>_>_>
                    *)contexts_abi_cxx11_,contextName);
    if (iVar3._M_node == (_Base_ptr)(contexts_abi_cxx11_ + 8)) {
      this->_vptr_AsioContextManager = (_func_int **)0x0;
      (this->super_enable_shared_from_this<gmlc::networking::AsioContextManager>)._M_weak_this.
      super___weak_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
    }
    else {
      this->_vptr_AsioContextManager = *(_func_int ***)(iVar3._M_node + 2);
      peVar1 = (element_type *)iVar3._M_node[2]._M_parent;
      (this->super_enable_shared_from_this<gmlc::networking::AsioContextManager>)._M_weak_this.
      super___weak_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           peVar1;
      if (peVar1 != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&(peVar1->super_enable_shared_from_this<gmlc::networking::AsioContextManager>).
                   _M_weak_this.
                   super___weak_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr =
               *(int *)&(peVar1->super_enable_shared_from_this<gmlc::networking::AsioContextManager>
                        )._M_weak_this.
                        super___weak_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr + 1;
          UNLOCK();
        }
        else {
          *(int *)&(peVar1->super_enable_shared_from_this<gmlc::networking::AsioContextManager>).
                   _M_weak_this.
                   super___weak_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr =
               *(int *)&(peVar1->super_enable_shared_from_this<gmlc::networking::AsioContextManager>
                        )._M_weak_this.
                        super___weak_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr + 1;
        }
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)contextLock);
    sVar4.super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = extraout_RDX._M_pi;
    sVar4.super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = this;
    return (shared_ptr<gmlc::networking::AsioContextManager>)
           sVar4.
           super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

std::shared_ptr<AsioContextManager>
    AsioContextManager::getExistingContextPointer(
        const std::string& contextName)
{
    std::lock_guard<std::mutex> ctxlock(
        contextLock);  // just to ensure that nothing funny happens if you try
    // to get a context while it is being constructed
    auto fnd = contexts.find(contextName);
    if (fnd != contexts.end()) {
        return fnd->second;
    }

    return nullptr;
}